

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_state_machine.cpp
# Opt level: O2

void __thiscall
duckdb::CSVStateMachine::CSVStateMachine
          (CSVStateMachine *this,CSVReaderOptions *options_p,
          CSVStateMachineOptions *state_machine_options_p,
          CSVStateMachineCache *csv_state_machine_cache)

{
  StateMachine *pSVar1;
  
  pSVar1 = CSVStateMachineCache::Get(csv_state_machine_cache,state_machine_options_p);
  this->transition_array = pSVar1;
  CSVStateMachineOptions::CSVStateMachineOptions
            (&this->state_machine_options,state_machine_options_p);
  this->options = options_p;
  DialectOptions::DialectOptions(&this->dialect_options);
  CSVStateMachineOptions::operator=
            (&(this->dialect_options).state_machine_options,&this->state_machine_options);
  return;
}

Assistant:

CSVStateMachine::CSVStateMachine(CSVReaderOptions &options_p, const CSVStateMachineOptions &state_machine_options_p,
                                 CSVStateMachineCache &csv_state_machine_cache)
    : transition_array(csv_state_machine_cache.Get(state_machine_options_p)),
      state_machine_options(state_machine_options_p), options(options_p) {
	dialect_options.state_machine_options = state_machine_options;
}